

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void qt_draw_decoration_for_glyphs
               (QPainter *painter,QPointF *decorationPosition,glyph_t *glyphArray,
               QFixedPoint *positions,int glyphCount,QFontEngine *fontEngine,bool underline,
               bool overline,bool strikeOut)

{
  bool bVar1;
  int *in_RCX;
  qreal in_RDX;
  QPointF *in_RSI;
  QTextEngine *in_RDI;
  int in_R8D;
  long *in_R9;
  long in_FS_OFFSET;
  qreal xpos;
  qreal ypos;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  qreal width;
  bool rtl;
  glyph_metrics_t gm;
  QFixed baseline;
  RenderFlags flags;
  RenderFlags in_stack_0000013c;
  QTextCharFormat *in_stack_000001c0;
  QFixed *in_stack_fffffffffffffed8;
  QFixed in_stack_fffffffffffffee0;
  int local_e4;
  UnderlineStyle underlineStyle;
  undefined4 in_stack_ffffffffffffff80;
  QFlagsStorage<QTextItem::RenderFlag> QVar2;
  QPointF *in_stack_ffffffffffffff88;
  QPainter *in_stack_ffffffffffffff90;
  QFixed local_5c;
  int local_58;
  undefined4 local_54;
  int local_50;
  QFixed local_4c;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QFixed local_30;
  int local_2c;
  int local_28;
  QFlagsStorage<QTextItem::RenderFlag> local_24 [5];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_stack_00000008 & 1) != 0) || ((in_stack_00000010 & 1) != 0)) ||
     ((in_stack_00000018 & 1) != 0)) {
    local_24[0].i = 0xaaaaaaaa;
    QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x59db1d);
    if ((in_stack_00000008 & 1) != 0) {
      QFlags<QTextItem::RenderFlag>::operator|=((QFlags<QTextItem::RenderFlag> *)local_24,Underline)
      ;
    }
    if ((in_stack_00000010 & 1) != 0) {
      QFlags<QTextItem::RenderFlag>::operator|=((QFlags<QTextItem::RenderFlag> *)local_24,Overline);
    }
    if ((in_stack_00000018 & 1) != 0) {
      QFlags<QTextItem::RenderFlag>::operator|=((QFlags<QTextItem::RenderFlag> *)local_24,StrikeOut)
      ;
    }
    local_28 = in_RCX[(long)(in_R8D + -1) * 2];
    local_2c = *in_RCX;
    bVar1 = operator<((QFixed)local_28,(QFixed)local_2c);
    local_30.val = in_RCX[1];
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    if (bVar1) {
      local_e4 = 0;
    }
    else {
      local_e4 = in_R8D + -1;
    }
    (**(code **)(*in_R9 + 0xe0))(&local_48,in_R9,*(undefined4 *)((long)in_RDX + (long)local_e4 * 4))
    ;
    if (bVar1) {
      local_54 = local_38._0_4_;
      local_50 = (int)QFixed::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      local_58 = in_RCX[(long)(in_R8D + -1) * 2];
      local_4c = QFixed::operator-(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      QFixed::toReal(&local_4c);
    }
    else {
      QFixed::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      local_5c = QFixed::operator-(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      QFixed::toReal(&local_5c);
    }
    xpos = QPointF::x(in_RSI);
    underlineStyle = (UnderlineStyle)((ulong)in_RSI >> 0x20);
    ypos = QFixed::toReal(&local_30);
    QPointF::QPointF((QPointF *)&stack0xffffffffffffff88,xpos,ypos);
    QVar2.i = local_24[0].i;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x59dde5);
    drawTextItemDecoration
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (QFontEngine *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80),in_RDI,underlineStyle,
               in_stack_0000013c,in_RDX,in_stack_000001c0);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x59de2c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_draw_decoration_for_glyphs(QPainter *painter,
                                          const QPointF &decorationPosition,
                                          const glyph_t *glyphArray,
                                          const QFixedPoint *positions,
                                          int glyphCount,
                                          QFontEngine *fontEngine,
                                          bool underline,
                                          bool overline,
                                          bool strikeOut)
{
    if (!underline && !overline && !strikeOut)
        return;

    QTextItem::RenderFlags flags;
    if (underline)
        flags |= QTextItem::Underline;
    if (overline)
        flags |= QTextItem::Overline;
    if (strikeOut)
        flags |= QTextItem::StrikeOut;

    bool rtl = positions[glyphCount - 1].x < positions[0].x;
    QFixed baseline = positions[0].y;
    glyph_metrics_t gm = fontEngine->boundingBox(glyphArray[rtl ? 0 : glyphCount - 1]);

    qreal width = rtl
            ? (positions[0].x + gm.xoff - positions[glyphCount - 1].x).toReal()
            : (positions[glyphCount - 1].x + gm.xoff - positions[0].x).toReal();

    drawTextItemDecoration(painter,
                           QPointF(decorationPosition.x(), baseline.toReal()),
                           fontEngine,
                           nullptr, // textEngine
                           underline ? QTextCharFormat::SingleUnderline
                                     : QTextCharFormat::NoUnderline,
                           flags,
                           width,
                           QTextCharFormat());
}